

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool CoreML::isIOS12NeuralNetworkLayer(NeuralNetworkLayer *layer)

{
  uint uVar1;
  bool bVar2;
  LayerUnion LVar3;
  uint32 uVar4;
  ulong uVar5;
  
  uVar4 = layer->_oneof_case_[0];
  if ((int)uVar4 < 0xdc) {
    if ((int)uVar4 < 0x8c) {
      if (uVar4 == 100) {
        return (layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1;
      }
      if ((uVar4 != 0x78) && (uVar4 != 0x82)) {
        return false;
      }
LAB_00264ad4:
      LVar3.upsample_ = Specification::UpsampleLayerParams::default_instance();
    }
    else {
      uVar5 = (ulong)(uVar4 - 0x8c);
      if (uVar4 - 0x8c < 0x3d) {
        if ((0x4000042000400U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00264b05;
        if ((0x1000010800100000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00264ad4;
        if (uVar5 == 0) {
          return (bool)(*(byte *)((long)&(((layer->layer_).convolution_)->stride_).rep_ + 1) ^ 1);
        }
      }
      if (uVar4 - 0xd3 < 2) goto LAB_00264b43;
      if (uVar4 != 0xd2) {
        return false;
      }
      LVar3 = layer->layer_;
    }
    if (((LVar3.convolution_)->dilationfactor_).current_size_ == 0) {
      if (layer->_oneof_case_[0] == 0xd2) {
        LVar3 = layer->layer_;
      }
      else {
        LVar3.upsample_ = Specification::UpsampleLayerParams::default_instance();
      }
      if (((LVar3.convolution_)->stride_).current_size_ < 1) {
        uVar4 = layer->_oneof_case_[0];
        goto LAB_00264b05;
      }
    }
LAB_00264b21:
    bVar2 = false;
  }
  else {
    if ((int)uVar4 < 0x122) {
      uVar1 = uVar4 - 0xdc;
      if (0x3c < uVar1) {
        return false;
      }
      if ((0x1004030042100000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        if ((0xc01UL >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
          return false;
        }
        goto LAB_00264ad4;
      }
LAB_00264b05:
      if (uVar4 == 0x159) {
        LVar3 = layer->layer_;
      }
      else {
        LVar3.reorganizedata_ = Specification::ReorganizeDataLayerParams::default_instance();
      }
      if (*(int *)&((LVar3.convolution_)->kernelsize_).rep_ == 2) goto LAB_00264b21;
    }
    else {
      uVar5 = (ulong)(uVar4 - 0x122);
      if (uVar4 - 0x122 < 0x3d) {
        if ((0x84000000100c01U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00264b05;
        if ((0x10040000000U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00264ad4;
        if (uVar5 != 0x3c) goto LAB_00264a21;
      }
      else {
LAB_00264a21:
        if ((uVar4 - 400 < 0x1f) && ((0x40100401U >> (uVar4 - 400 & 0x1f) & 1) != 0))
        goto LAB_00264b05;
        if (uVar4 != 500) {
          return false;
        }
      }
    }
LAB_00264b43:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool CoreML::isIOS12NeuralNetworkLayer(const Specification::NeuralNetworkLayer& layer) {

    // Return True if the NN layer is from the set exposed in iOS 12
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kConvolution:
            return (layer.input().size() == 1);
        case Specification::NeuralNetworkLayer::LayerCase::kInnerProduct:
            return !layer.innerproduct().int8dynamicquantize();
        case Specification::NeuralNetworkLayer::LayerCase::kBatchnorm:
        case Specification::NeuralNetworkLayer::LayerCase::kActivation:
        case Specification::NeuralNetworkLayer::LayerCase::kPooling:
        case Specification::NeuralNetworkLayer::LayerCase::kPadding:
        case Specification::NeuralNetworkLayer::LayerCase::kConcat:
        case Specification::NeuralNetworkLayer::LayerCase::kLrn:
        case Specification::NeuralNetworkLayer::LayerCase::kSoftmax:
        case Specification::NeuralNetworkLayer::LayerCase::kSplit:
        case Specification::NeuralNetworkLayer::LayerCase::kAdd:
        case Specification::NeuralNetworkLayer::LayerCase::kMultiply:
        case Specification::NeuralNetworkLayer::LayerCase::kUnary:
        case Specification::NeuralNetworkLayer::LayerCase::kUpsample:
            if (layer.upsample().linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
                return false;
            }
            if (layer.upsample().fractionalscalingfactor_size() > 0) {
                return false;
            }
        case Specification::NeuralNetworkLayer::LayerCase::kBias:
        case Specification::NeuralNetworkLayer::LayerCase::kL2Normalize:
        case Specification::NeuralNetworkLayer::LayerCase::kReshape:
        case Specification::NeuralNetworkLayer::LayerCase::kFlatten:
        case Specification::NeuralNetworkLayer::LayerCase::kPermute:
        case Specification::NeuralNetworkLayer::LayerCase::kReduce:
        case Specification::NeuralNetworkLayer::LayerCase::kLoadConstant:
        case Specification::NeuralNetworkLayer::LayerCase::kScale:
        case Specification::NeuralNetworkLayer::LayerCase::kSimpleRecurrent:
        case Specification::NeuralNetworkLayer::LayerCase::kGru:
        case Specification::NeuralNetworkLayer::LayerCase::kUniDirectionalLSTM:
        case Specification::NeuralNetworkLayer::LayerCase::kBiDirectionalLSTM:
        case Specification::NeuralNetworkLayer::LayerCase::kCrop:
        case Specification::NeuralNetworkLayer::LayerCase::kAverage:
        case Specification::NeuralNetworkLayer::LayerCase::kMax:
        case Specification::NeuralNetworkLayer::LayerCase::kMin:
        case Specification::NeuralNetworkLayer::LayerCase::kDot:
        case Specification::NeuralNetworkLayer::LayerCase::kMvn:
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding:
        case Specification::NeuralNetworkLayer::LayerCase::kSequenceRepeat:
        case Specification::NeuralNetworkLayer::LayerCase::kReorganizeData:
            if (layer.reorganizedata().mode() == Specification::ReorganizeDataLayerParams::PIXEL_SHUFFLE) {
                      return false;
            }
        case Specification::NeuralNetworkLayer::LayerCase::kSlice:
        case Specification::NeuralNetworkLayer::LayerCase::kCustom:
        case Specification::NeuralNetworkLayer::kResizeBilinear:
        case Specification::NeuralNetworkLayer::kCropResize:
            return true;
        default:
            return false;
    }
}